

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PClass::BuildFlatPointers(PClass *this)

{
  ulong uVar1;
  size_t *__src;
  PClass *pPVar2;
  long lVar3;
  size_t *__dest;
  ulong uVar4;
  size_t __n;
  
  if (this->FlatPointers == (size_t *)0x0) {
    if (this->ParentClass == (PClass *)0x0) {
      __dest = &TheEnd;
      if (this->Pointers != (size_t *)0x0) {
        __dest = this->Pointers;
      }
    }
    else {
      BuildFlatPointers(this->ParentClass);
      __src = this->Pointers;
      if (__src == (size_t *)0x0) {
        __dest = this->ParentClass->FlatPointers;
      }
      else {
        uVar1 = 0;
        do {
          uVar4 = uVar1;
          uVar1 = uVar4 + 8;
        } while (*(long *)((long)__src + uVar4) != -1);
        pPVar2 = this->ParentClass;
        __n = 0xfffffffffffffff8;
        do {
          uVar4 = uVar4 + 8;
          lVar3 = __n + 8;
          __n = __n + 8;
        } while (*(long *)((long)pPVar2->FlatPointers + lVar3) != -1);
        __dest = (size_t *)operator_new__(uVar4 & 0x7fffffff8);
        if (__n != 0) {
          memcpy(__dest,pPVar2->FlatPointers,__n);
        }
        memcpy((void *)((long)__dest + __n),__src,uVar1 & 0x7fffffff8);
      }
    }
    this->FlatPointers = __dest;
    return;
  }
  return;
}

Assistant:

void PClass::BuildFlatPointers ()
{
	if (FlatPointers != NULL)
	{ // Already built: Do nothing.
		return;
	}
	else if (ParentClass == NULL)
	{ // No parent: FlatPointers is the same as Pointers.
		if (Pointers == NULL)
		{ // No pointers: Make FlatPointers a harmless non-NULL.
			FlatPointers = &TheEnd;
		}
		else
		{
			FlatPointers = Pointers;
		}
	}
	else
	{
		ParentClass->BuildFlatPointers ();
		if (Pointers == NULL)
		{ // No new pointers: Just use the same FlatPointers as the parent.
			FlatPointers = ParentClass->FlatPointers;
		}
		else
		{ // New pointers: Create a new FlatPointers array and add them.
			int numPointers, numSuperPointers;

			// Count pointers defined by this class.
			for (numPointers = 0; Pointers[numPointers] != ~(size_t)0; numPointers++)
			{ }
			// Count pointers defined by superclasses.
			for (numSuperPointers = 0; ParentClass->FlatPointers[numSuperPointers] != ~(size_t)0; numSuperPointers++)
			{ }

			// Concatenate them into a new array
			size_t *flat = new size_t[numPointers + numSuperPointers + 1];
			if (numSuperPointers > 0)
			{
				memcpy (flat, ParentClass->FlatPointers, sizeof(size_t)*numSuperPointers);
			}
			memcpy (flat + numSuperPointers, Pointers, sizeof(size_t)*(numPointers+1));
			FlatPointers = flat;
		}
	}
}